

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::iterate(AsyncCase *this)

{
  ResultCollector *results;
  Context *pCVar1;
  pointer pTVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  _Self __tmp;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var7;
  NotSupportedError *this_00;
  string *description;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar8;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *tbs;
  size_t tbslen;
  int ndx;
  long lVar9;
  deUint32 milliseconds;
  uint uVar10;
  long lVar11;
  undefined8 *puVar12;
  allocator<char> local_242;
  allocator<char> local_241;
  TestLog *local_240;
  ScopedLogSection section;
  int local_22c;
  string local_220;
  undefined8 *local_200;
  GLint numMessages;
  uint uStack_1f4;
  ostringstream local_1f0 [376];
  DebugMessageTestContext context;
  long lVar6;
  
  bVar3 = isKHRDebugSupported((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  if (!bVar3) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x5bc);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_240 = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  pCVar1 = (this->super_BaseCase).super_ErrorCase.super_TestCase.m_context;
  results = &(this->super_BaseCase).m_results;
  DebugMessageTestContext::DebugMessageTestContext
            (&context,&this->super_BaseCase,pCVar1->m_renderCtx,pCVar1->m_contextInfo,local_240,
             results,true);
  _numMessages = (pointer)((ulong)uStack_1f4 << 0x20);
  (**(code **)(lVar6 + 0x868))(0x9145);
  (**(code **)(lVar6 + 0x7e0))((ulong)_numMessages & 0xffffffff,0,0,0,0,0,0,0);
  (**(code **)(lVar6 + 0x5e0))(0x92e0);
  (**(code **)(lVar6 + 0x5e0))(0x8242);
  (**(code **)(lVar6 + 0x428))(0x1100,0x1100,0x1100,0,0,0);
  tbslen = 1;
  tbs = (uchar *)0x0;
  local_22c = 1;
  (**(code **)(lVar6 + 0x428))(0x8246,0x824c,0x1100,0);
  if (this->m_useCallbacks == true) {
    (**(code **)(lVar6 + 0x420))(BaseCase::callbackHandle,this);
  }
  else {
    (**(code **)(lVar6 + 0x420))(0,0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numMessages,"reference run",&local_241);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Reference run (synchronous)",&local_242);
  tcu::ScopedLogSection::ScopedLogSection(&section,local_240,(string *)&numMessages,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&numMessages);
  lVar11 = 0;
  for (lVar9 = 0;
      pTVar2 = (this->m_errorFuncs).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar9 < (int)((ulong)((long)(this->m_errorFuncs).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) >> 4);
      lVar9 = lVar9 + 1) {
    TestFunctionWrapper::call((TestFunctionWrapper *)((long)&pTVar2->m_type + lVar11),&context);
    lVar11 = lVar11 + 0x10;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if ((this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar3 = BaseCase::isDebugContext(&this->super_BaseCase);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numMessages,
                 "Need debug context to guarantee implementation behaviour (see command line options)"
                 ,(allocator<char> *)&local_220);
      tcu::ResultCollector::addResult(results,QP_TEST_RESULT_QUALITY_WARNING,(string *)&numMessages)
      ;
      std::__cxx11::string::~string((string *)&numMessages);
    }
    _numMessages = (pointer)local_240;
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    std::operator<<((ostream *)local_1f0,"Reference run produced no messages, nothing to verify");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numMessages,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1f0);
    (**(code **)(lVar6 + 0x420))(0,0);
    puVar12 = (undefined8 *)(lVar6 + 0x4e8);
  }
  else {
    for (p_Var7 = (this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(this->m_counts)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      *(undefined4 *)&p_Var7[1]._M_left = *(undefined4 *)((long)&p_Var7[1]._M_parent + 4);
      *(undefined4 *)((long)&p_Var7[1]._M_parent + 4) = 0;
    }
    (**(code **)(lVar6 + 0x4e8))(0x8242);
    local_200 = (undefined8 *)(lVar6 + 0x4e8);
    lVar11 = 0;
    for (lVar9 = 0;
        pTVar2 = (this->m_errorFuncs).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar9 < (int)((ulong)((long)(this->m_errorFuncs).
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) >> 4)
        ; lVar9 = lVar9 + 1) {
      TestFunctionWrapper::call((TestFunctionWrapper *)((long)&pTVar2->m_type + lVar11),&context);
      lVar11 = lVar11 + 0x10;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&numMessages,"result run",&local_241);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"Result run (asynchronous)",&local_242);
    description = &local_220;
    tcu::ScopedLogSection::ScopedLogSection(&section,local_240,(string *)&numMessages,description);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&numMessages);
    iVar4 = 2;
    uVar10 = 0;
    puVar8 = extraout_RDX;
LAB_003d1037:
    iVar5 = verify(this,(EVP_PKEY_CTX *)0x0,puVar8,(size_t)description,tbs,tbslen);
    milliseconds = uVar10 >> 2;
    if (milliseconds < 0x33) {
      milliseconds = 0x32;
    }
    if (iVar5 == 0) {
      local_22c = 0;
      puVar8 = extraout_RDX_00;
LAB_003d113e:
      verify(this,(EVP_PKEY_CTX *)0x1,puVar8,(size_t)description,tbs,tbslen);
      if ((99 < uVar10) && (iVar4 != local_22c)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&numMessages,
                   "Async messages were returned to application somewhat slowly",
                   (allocator<char> *)&local_220);
        tcu::ResultCollector::addResult
                  (results,QP_TEST_RESULT_QUALITY_WARNING,(string *)&numMessages);
        std::__cxx11::string::~string((string *)&numMessages);
      }
      _numMessages = (pointer)local_240;
      std::__cxx11::ostringstream::ostringstream(local_1f0);
      std::operator<<((ostream *)local_1f0,"Passed after ~");
      std::ostream::operator<<(local_1f0,uVar10);
      std::operator<<((ostream *)local_1f0,"ms of waiting");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&numMessages,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1f0);
      goto LAB_003d1281;
    }
    description = (string *)CONCAT71((int7)((ulong)description >> 8),iVar5 == 1);
    bVar3 = 9999 < uVar10 && iVar5 == 1;
    puVar8 = (uchar *)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),bVar3);
    if (bVar3) goto LAB_003d113e;
    if (uVar10 < 10000) {
      if (uVar10 < 100) {
        iVar4 = iVar5;
      }
      deSleep(milliseconds);
      uVar10 = uVar10 + milliseconds;
      puVar8 = extraout_RDX_01;
      if (this->m_useCallbacks == false) {
        fetchLogMessages(this);
        puVar8 = extraout_RDX_02;
      }
      goto LAB_003d1037;
    }
    verify(this,(EVP_PKEY_CTX *)0x1,puVar8,(size_t)description,tbs,tbslen);
    _numMessages = (pointer)local_240;
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    std::operator<<((ostream *)local_1f0,"Waited for ~");
    std::ostream::operator<<(local_1f0,uVar10);
    std::operator<<((ostream *)local_1f0,"ms without getting all expected messages");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numMessages,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&numMessages,
               "Async messages were not returned to application within a reasonable timeframe",
               (allocator<char> *)&local_220);
    tcu::ResultCollector::addResult(results,QP_TEST_RESULT_FAIL,(string *)&numMessages);
    std::__cxx11::string::~string((string *)&numMessages);
LAB_003d1281:
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    (**(code **)(lVar6 + 0x420))(0,0);
    puVar12 = local_200;
  }
  (*(code *)*puVar12)(0x92e0);
  tcu::ResultCollector::setTestContextResult
            (results,(this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx);
  NegativeTestShared::NegativeTestContext::~NegativeTestContext(&context.super_NegativeTestContext);
  return STOP;
}

Assistant:

AsyncCase::IterateResult AsyncCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::TestLog&			log			= m_testCtx.getLog();
	DebugMessageTestContext	context		= DebugMessageTestContext(*this, m_context.getRenderContext(), m_context.getContextInfo(), log, m_results, true);
	const int				maxWait		= 10000; // ms
	const int				warnWait	= 100;

	// Clear log from earlier messages
	{
		GLint numMessages = 0;
		gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMessages);
		gl.getDebugMessageLog(numMessages, 0, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL);
	}

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, false);

	// Some messages could be dependent on the value of DEBUG_OUTPUT_SYNCHRONOUS so only use API errors which should be generated in all cases
	gl.debugMessageControl(GL_DEBUG_SOURCE_API, GL_DEBUG_TYPE_ERROR, GL_DONT_CARE, 0, DE_NULL, true);

	if (m_useCallbacks) // will use log otherwise
		gl.debugMessageCallback(callbackHandle, this);
	else
		gl.debugMessageCallback(DE_NULL, DE_NULL);

	// Reference run (synchoronous)
	{
		tcu::ScopedLogSection section(log, "reference run", "Reference run (synchronous)");

		for (int ndx = 0; ndx < int(m_errorFuncs.size()); ndx++)
			m_errorFuncs[ndx].call(context);
	}

	if (m_counts.empty())
	{
		if (!isDebugContext())
			m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Need debug context to guarantee implementation behaviour (see command line options)");

		log << TestLog::Message << "Reference run produced no messages, nothing to verify" << TestLog::EndMessage;

		gl.debugMessageCallback(DE_NULL, DE_NULL);
		gl.disable(GL_DEBUG_OUTPUT);

		m_results.setTestContextResult(m_testCtx);
		return STOP;
	}

	for (MessageCounter::iterator itr = m_counts.begin(); itr != m_counts.end(); itr++)
	{
		itr->second.expected = itr->second.received;
		itr->second.received = 0;
	}

	gl.disable(GL_DEBUG_OUTPUT_SYNCHRONOUS);

	// Result run (async)
	for (int ndx = 0; ndx < int(m_errorFuncs.size()); ndx++)
		m_errorFuncs[ndx].call(context);

	// Repatedly try verification, new results may be added to m_receivedMessages at any time
	{
		tcu::ScopedLogSection	section			(log, "result run", "Result run (asynchronous)");
		VerifyState				lastTimelyState = VERIFY_FAIL;

		for (int waited = 0;;)
		{
			const VerifyState	pass = verify(false);
			const int			wait = de::max(50, waited>>2);

			// Pass (possibly due to time limit)
			if (pass == VERIFY_PASS || (pass == VERIFY_MINIMUM && waited >= maxWait))
			{
				verify(true); // log

				// State changed late
				if (waited >= warnWait && lastTimelyState != pass)
					m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Async messages were returned to application somewhat slowly");

				log << TestLog::Message << "Passed after ~" << waited << "ms of waiting" << TestLog::EndMessage;
				break;
			}
			// fail
			else if (waited >= maxWait)
			{
				verify(true); // log

				log << TestLog::Message << "Waited for ~" << waited << "ms without getting all expected messages" << TestLog::EndMessage;
				m_results.addResult(QP_TEST_RESULT_FAIL, "Async messages were not returned to application within a reasonable timeframe");
				break;
			}

			if (waited < warnWait)
				lastTimelyState = pass;

			deSleep(wait);
			waited += wait;

			if (!m_useCallbacks)
				fetchLogMessages();
		}
	}

	gl.debugMessageCallback(DE_NULL, DE_NULL);

	gl.disable(GL_DEBUG_OUTPUT);
	m_results.setTestContextResult(m_testCtx);

	return STOP;
}